

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void restore_stack_limit(lua_State *L)

{
  int inuse;
  lua_State *L_local;
  
  if ((20000 < L->size_ci) && ((int)(((long)L->ci - (long)L->base_ci) / 0x28) + 1 < 20000)) {
    luaD_reallocCI(L,20000);
  }
  return;
}

Assistant:

static void restore_stack_limit(lua_State*L){
if(L->size_ci>20000){
int inuse=cast_int(L->ci-L->base_ci);
if(inuse+1<20000)
luaD_reallocCI(L,20000);
}
}